

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

char * copy_trunc(char *p,char *str,int maxl,int quote)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  int iVar6;
  
  sVar3 = strlen(str);
  if (quote != 0) {
    *p = '\"';
    p = p + 1;
  }
  if (0 < maxl) {
    pbVar5 = (byte *)(str + sVar3);
    iVar6 = 0;
    do {
      bVar1 = *str;
      pcVar4 = (char *)CONCAT71((int7)(sVar3 >> 8),bVar1);
      if (bVar1 < 0x20) goto LAB_00180644;
      uVar2 = fl_utf8len(bVar1);
      sVar3 = CONCAT44(extraout_var,uVar2);
      if (((int)uVar2 < 1) || (pbVar5 < (byte *)str + uVar2)) break;
      do {
        bVar1 = *str;
        str = (char *)((byte *)str + 1);
        *p = bVar1;
        p = (char *)((byte *)p + 1);
        uVar2 = (int)sVar3 - 1;
        sVar3 = (size_t)uVar2;
      } while (uVar2 != 0);
      iVar6 = iVar6 + 1;
    } while (iVar6 != maxl);
  }
  pcVar4 = (char *)CONCAT71((int7)(sVar3 >> 8),*str);
LAB_00180644:
  if ((char)pcVar4 != '\0') {
    ((byte *)p)[0] = 0x2e;
    ((byte *)p)[1] = 0x2e;
    ((byte *)p)[2] = 0x2e;
    ((byte *)p)[3] = 0;
    p = (char *)((byte *)p + 3);
  }
  if (quote != 0) {
    *p = 0x22;
    p = (char *)((byte *)p + 1);
  }
  *p = 0;
  return pcVar4;
}

Assistant:

static char *copy_trunc(char *p, const char *str, int maxl, int quote) {

  int size = 0;				// truncated string size in characters
  int bs;				// size of UTF-8 character in bytes
  const char *end = str + strlen(str);	// end of input string
  if (quote) *p++ = '"';		// opening quote
  while (size < maxl) {			// maximum <maxl> characters
    if (!(*str & (-32))) break;		// end of string (0 or control char)
    bs = fl_utf8len(*str);		// size of next character
    if (bs <= 0) break;			// some error - leave
    if (str + bs > end) break;		// UTF-8 sequence beyond end of string
    while (bs--) *p++ = *str++;		// copy that character into the buffer
    size++;				// count copied characters
  }
  if (*str) {				// string was truncated
    strcpy(p,"..."); p += 3;
  }
  if (quote) *p++ = '"';		// closing quote
  *p = 0;				// terminating null byte
  return p;
}